

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i64_Extend_i32u(w3Interp *this)

{
  pointer pwVar1;
  Value *pVVar2;
  Value VVar3;
  
  pVVar2 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  VVar3.u64._4_4_ = 0;
  VVar3.i32 = pVVar2->u32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  pwVar1 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar1[-1].value.tag = Tag_i64;
  pwVar1[-1].value.value = VVar3;
  return;
}

Assistant:

INTERP (i64_Extend_i32u)
{
    set_u64 ((uint64_t)u32 ());
}